

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
syntax_tests::iu_SyntaxTest_x_iutest_x_Double_Test::iu_SyntaxTest_x_iutest_x_Double_Test
          (iu_SyntaxTest_x_iutest_x_Double_Test *this)

{
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00394aa8;
  return;
}

Assistant:

IUTEST(SyntaxTest, Double)
{
    if( double d = 1.0 )
        IUTEST_ASSERT_DOUBLE_EQ(1.0, d) << d;
    if( double d = 1.0 )
        IUTEST_EXPECT_DOUBLE_EQ(1.0, d) << d;
    if( double d = 1.0 )
        IUTEST_INFORM_DOUBLE_EQ(1.0, d) << d;
    if( double d = 1.0 )
        IUTEST_ASSUME_DOUBLE_EQ(1.0, d) << d;
}